

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O0

AnimationIndex __thiscall
QSequentialAnimationGroupPrivate::indexForCurrentTime(QSequentialAnimationGroupPrivate *this)

{
  parameter_type pVar1;
  long lVar2;
  qsizetype qVar3;
  long in_RDI;
  long in_FS_OFFSET;
  int i;
  int duration;
  AnimationIndex ret;
  int iVar4;
  int iVar5;
  AnimationIndex local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.index = -0x55555556;
  local_10.timeOffset = -0x55555556;
  AnimationIndex::AnimationIndex(&local_10);
  iVar5 = 0;
  iVar4 = 0;
  do {
    lVar2 = (long)iVar4;
    qVar3 = QList<QAbstractAnimation_*>::size((QList<QAbstractAnimation_*> *)(in_RDI + 0xa0));
    if (qVar3 <= lVar2) {
      local_10.timeOffset = local_10.timeOffset - iVar5;
      qVar3 = QList<QAbstractAnimation_*>::size((QList<QAbstractAnimation_*> *)(in_RDI + 0xa0));
      local_10.index = (int)qVar3 + -1;
LAB_00689ece:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_10;
      }
      __stack_chk_fail();
    }
    iVar5 = animationActualTotalDuration
                      ((QSequentialAnimationGroupPrivate *)CONCAT44(iVar5,iVar4),
                       (int)((ulong)in_RDI >> 0x20));
    if ((iVar5 == -1) || (*(int *)(in_RDI + 0x84) < local_10.timeOffset + iVar5)) {
LAB_00689e81:
      local_10.index = iVar4;
      goto LAB_00689ece;
    }
    if (*(int *)(in_RDI + 0x84) == local_10.timeOffset + iVar5) {
      pVar1 = ::QObjectCompatProperty::operator_cast_to_Direction
                        ((QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                          *)0x689e7c);
      if (pVar1 == Backward) goto LAB_00689e81;
    }
    local_10.timeOffset = iVar5 + local_10.timeOffset;
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

QSequentialAnimationGroupPrivate::AnimationIndex QSequentialAnimationGroupPrivate::indexForCurrentTime() const
{
    Q_ASSERT(!animations.isEmpty());

    AnimationIndex ret;
    int duration = 0;

    for (int i = 0; i < animations.size(); ++i) {
        duration = animationActualTotalDuration(i);

        // 'animation' is the current animation if one of these reasons is true:
        // 1. it's duration is undefined
        // 2. it ends after msecs
        // 3. it is the last animation (this can happen in case there is at least 1 uncontrolled animation)
        // 4. it ends exactly in msecs and the direction is backwards
        if (duration == -1 || currentTime < (ret.timeOffset + duration)
            || (currentTime == (ret.timeOffset + duration) && direction == QAbstractAnimation::Backward)) {
            ret.index = i;
            return ret;
        }

        // 'animation' has a non-null defined duration and is not the one at time 'msecs'.
        ret.timeOffset += duration;
    }

    // this can only happen when one of those conditions is true:
    // 1. the duration of the group is undefined and we passed its actual duration
    // 2. there are only 0-duration animations in the group
    ret.timeOffset -= duration;
    ret.index = animations.size() - 1;
    return ret;
}